

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenCallRefGetOperandAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  Expression **ppEVar1;
  
  if (expr->_id != CallRefId) {
    __assert_fail("expression->is<CallRef>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xfaa,
                  "BinaryenExpressionRef BinaryenCallRefGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < expr[1].type.id) {
    ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (expr + 1),(ulong)index);
    return *ppEVar1;
  }
  __assert_fail("index < static_cast<CallRef*>(expression)->operands.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xfab,
                "BinaryenExpressionRef BinaryenCallRefGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenCallRefGetOperandAt(BinaryenExpressionRef expr,
                                                  BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallRef>());
  assert(index < static_cast<CallRef*>(expression)->operands.size());
  return static_cast<CallRef*>(expression)->operands[index];
}